

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O3

void check_object_ref<debugger_type>(object_ref<debugger_type,_false> *ref,debugger_type *value)

{
  int iVar1;
  int iVar2;
  debugger_type *pdVar3;
  object_ref<debugger_type,_false> *poVar4;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_130;
  AssertionHandler local_120;
  object_ref<debugger_type,_false> *local_d8;
  ITransientExpression local_d0;
  debugger_type *local_c0;
  char *local_b8;
  size_t sStack_b0;
  debugger_type *local_a8;
  debugger_type *local_a0;
  debugger_type *local_98;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x16;
  Catch::StringRef::StringRef(&local_40,"value.ctor()");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_40,Normal);
  local_d0._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_d0._vptr_ITransientExpression._1_7_,value->from_ctor);
  Catch::AssertionHandler::handleExpr<bool>(&local_120,(ExprLhs<bool> *)&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x17;
  Catch::StringRef::StringRef(&local_50,"&ref.get() == &value");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_50,Normal);
  pdVar3 = ref->ptr_;
  local_d8 = ref;
  local_a0 = value;
  local_98 = pdVar3;
  Catch::StringRef::StringRef((StringRef *)&local_130,"==");
  local_d0.m_result = pdVar3 == value;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00230030;
  local_b8 = local_130.file;
  sStack_b0 = local_130.line;
  local_c0 = (debugger_type *)&local_98;
  local_a8 = (debugger_type *)&local_a0;
  Catch::AssertionHandler::handleExpr(&local_120,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  poVar4 = local_d8;
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x18;
  Catch::StringRef::StringRef(&local_60,"&*ref == &value");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_60,Normal);
  pdVar3 = poVar4->ptr_;
  local_a0 = value;
  local_98 = pdVar3;
  Catch::StringRef::StringRef((StringRef *)&local_130,"==");
  local_d0.m_result = pdVar3 == value;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00230030;
  local_c0 = (debugger_type *)&local_98;
  local_b8 = local_130.file;
  sStack_b0 = local_130.line;
  local_a8 = (debugger_type *)&local_a0;
  Catch::AssertionHandler::handleExpr(&local_120,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x19;
  Catch::StringRef::StringRef(&local_70,"ref->id == value.id");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_70,Normal);
  pdVar3 = poVar4->ptr_;
  iVar1 = pdVar3->id;
  iVar2 = value->id;
  Catch::StringRef::StringRef((StringRef *)&local_130,"==");
  local_d0.m_result = iVar1 == iVar2;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f648;
  local_b8 = local_130.file;
  sStack_b0 = local_130.line;
  local_c0 = pdVar3;
  local_a8 = value;
  Catch::AssertionHandler::handleExpr(&local_120,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  poVar4 = local_d8;
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x1a;
  Catch::StringRef::StringRef(&local_80,"ref == value");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_80,Normal);
  pdVar3 = poVar4->ptr_;
  Catch::StringRef::StringRef((StringRef *)&local_130,"==");
  local_d0.m_result = pdVar3 == value;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00230070;
  local_c0 = (debugger_type *)poVar4;
  local_b8 = local_130.file;
  sStack_b0 = local_130.line;
  local_a8 = value;
  Catch::AssertionHandler::handleExpr(&local_120,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_d0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_d0.m_isBinaryExpression = true;
  local_d0.m_result = false;
  local_d0._10_6_ = 0;
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_130.line = 0x1b;
  Catch::StringRef::StringRef(&local_90,"value == ref");
  Catch::AssertionHandler::AssertionHandler
            (&local_120,(StringRef *)&local_d0,&local_130,local_90,Normal);
  pdVar3 = poVar4->ptr_;
  Catch::StringRef::StringRef((StringRef *)&local_130,"==");
  local_d0.m_result = pdVar3 == value;
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_002300b0;
  local_b8 = local_130.file;
  sStack_b0 = local_130.line;
  local_a8 = (debugger_type *)poVar4;
  local_c0 = value;
  Catch::AssertionHandler::handleExpr(&local_120,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::AssertionHandler::complete(&local_120);
  if (local_120.m_completed == false) {
    (*(local_120.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void check_object_ref(const object_ref<T>& ref, const debugger_type& value)
{
    REQUIRE(value.ctor());
    REQUIRE(&ref.get() == &value);
    REQUIRE(&*ref == &value);
    REQUIRE(ref->id == value.id);
    REQUIRE(ref == value);
    REQUIRE(value == ref);
}